

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

option_results * __thiscall argagg::option_results::as<std::__cxx11::string>(option_results *this)

{
  size_type sVar1;
  out_of_range *this_00;
  vector<argagg::option_result,_std::allocator<argagg::option_result>_> *in_RSI;
  option_results *this_local;
  
  sVar1 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::size(in_RSI);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"no option arguments to convert");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::back(in_RSI);
  option_result::as<std::__cxx11::string>((option_result *)this);
  return this;
}

Assistant:

T option_results::as() const
{
  if (this->all.size() == 0) {
    throw std::out_of_range("no option arguments to convert");
  }
  return this->all.back().as<T>();
}